

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::UnfocusDocument(Context *this,ElementDocument *document)

{
  bool bVar1;
  reference ppEVar2;
  Element *this_00;
  const_iterator local_40;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_38;
  Element **local_30;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_28;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_20;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  it;
  ElementDocument *document_local;
  Context *this_local;
  
  it._M_current = (Element **)document;
  local_28._M_current =
       (Element **)
       ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::begin
                 (&this->document_focus_history);
  local_30 = (Element **)
             ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                       (&this->document_focus_history);
  local_20 = ::std::
             find<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,Rml::ElementDocument*>
                       (local_28,(__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                                  )local_30,(ElementDocument **)&it);
  local_38._M_current =
       (Element **)
       ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                 (&this->document_focus_history);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::__normal_iterator<Rml::Element**>
              ((__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)&local_40,&local_20);
    ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::erase
              (&this->document_focus_history,local_40);
  }
  bVar1 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::empty
                    (&this->document_focus_history);
  if (!bVar1) {
    ppEVar2 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::back
                        (&this->document_focus_history);
    this_00 = Element::GetFocusLeafNode(*ppEVar2);
    Element::Focus(this_00,false);
  }
  return;
}

Assistant:

void Context::UnfocusDocument(ElementDocument* document)
{
	auto it = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (it != document_focus_history.end())
		document_focus_history.erase(it);

	if (!document_focus_history.empty())
		document_focus_history.back()->GetFocusLeafNode()->Focus();
}